

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O3

int BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transfom_idx)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  
  puVar3 = transforms->prefix_suffix;
  puVar4 = transforms->transforms;
  lVar10 = (long)transfom_idx * 3;
  uVar11 = (ulong)transforms->prefix_suffix_map[puVar4[lVar10]];
  bVar1 = puVar4[lVar10 + 1];
  uVar8 = (ulong)transforms->prefix_suffix_map[puVar4[lVar10 + 2]];
  bVar2 = puVar3[uVar11];
  if (bVar2 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      dst[uVar7] = puVar3[uVar7 + uVar11 + 1];
      uVar7 = uVar7 + 1;
    } while ((uint)bVar2 != (uint)uVar7);
  }
  uVar13 = (uint)bVar1;
  if (bVar1 < 10) {
    len = len - uVar13;
  }
  else if ((byte)(bVar1 - 0xc) < 9) {
    word = word + (bVar1 - 0xb);
    len = len - (bVar1 - 0xb);
  }
  if (0 < len) {
    uVar11 = 0;
    do {
      dst[uVar11 + (uVar7 & 0xffffffff)] = word[uVar11];
      uVar11 = uVar11 + 1;
    } while ((uint)len != uVar11);
    uVar7 = (ulong)(uint)((int)uVar7 + (int)uVar11);
  }
  iVar6 = (int)uVar7;
  if (uVar13 == 0xb) {
    if (0 < len) {
      pbVar12 = dst + (iVar6 - len);
      do {
        bVar1 = *pbVar12;
        if (bVar1 < 0xc0) {
          uVar13 = 1;
          if ((byte)(bVar1 + 0x9f) < 0x1a) {
            *pbVar12 = bVar1 & 0x5f;
          }
        }
        else if (bVar1 < 0xe0) {
          pbVar12[1] = pbVar12[1] ^ 0x20;
          uVar13 = 2;
        }
        else {
          pbVar12[2] = pbVar12[2] ^ 5;
          uVar13 = 3;
        }
        pbVar12 = pbVar12 + uVar13;
        uVar9 = len - uVar13;
        bVar5 = (int)uVar13 <= len;
        len = uVar9;
      } while (uVar9 != 0 && bVar5);
    }
  }
  else if (uVar13 == 10) {
    lVar10 = (long)(iVar6 - len);
    bVar1 = dst[lVar10];
    if (bVar1 < 0xc0) {
      if ((byte)(bVar1 + 0x9f) < 0x1a) {
        dst[lVar10] = bVar1 & 0x5f;
      }
    }
    else if (bVar1 < 0xe0) {
      dst[lVar10 + 1] = dst[lVar10 + 1] ^ 0x20;
    }
    else {
      dst[lVar10 + 2] = dst[lVar10 + 2] ^ 5;
    }
  }
  bVar1 = puVar3[uVar8];
  if (bVar1 != 0) {
    lVar10 = 0;
    do {
      dst[lVar10 + (uVar7 & 0xffffffff)] = puVar3[lVar10 + uVar8 + 1];
      lVar10 = lVar10 + 1;
    } while ((uint)bVar1 != (uint)lVar10);
    iVar6 = iVar6 + (uint)lVar10;
  }
  return iVar6;
}

Assistant:

int BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* BROTLI_RESTRICT transforms, int transfom_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transfom_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transfom_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transfom_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}